

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

ON_SubDEdgePtr __thiscall
ON_SubD_FixedSizeHeap::FindOrAllocateEdge
          (ON_SubD_FixedSizeHeap *this,ON_SubDVertex *v0,double v0_sector_coefficient,
          ON_SubDVertex *v1,double v1_sector_coefficient)

{
  ON_SubDVertex *pOVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDEdgePtr unaff_R12;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  ON_SubDEdgePtr ep;
  ON_SubDEdgePtr local_58;
  ON_SubDVertex *local_50;
  ON_SubD_FixedSizeHeap *local_48;
  double local_40;
  double local_38;
  
  local_40 = v0_sector_coefficient;
  local_38 = v1_sector_coefficient;
  if ((((v0 == (ON_SubDVertex *)0x0) || (v0->m_edges == (ON_SubDEdgePtr *)0x0)) ||
      (v1 == (ON_SubDVertex *)0x0)) || (v1->m_edges == (ON_SubDEdgePtr *)0x0)) {
    ON_SubDIncrementErrorCount();
    unaff_R12 = (ON_SubDEdgePtr)0;
  }
  else {
    bVar4 = v0->m_edge_count != 0;
    local_50 = v1;
    local_48 = this;
    if (bVar4) {
      uVar3 = 0;
      do {
        local_58.m_ptr = v0->m_edges[uVar3].m_ptr;
        pOVar1 = ON_SubDEdgePtr::RelativeVertex(&local_58,0);
        pOVar2 = ON_SubDEdgePtr::RelativeVertex(&local_58,1);
        if (pOVar1 == v0) {
          bVar5 = pOVar2 != local_50;
          if (!bVar5) {
            unaff_R12.m_ptr = local_58.m_ptr;
          }
        }
        else if (pOVar2 == v0) {
          pOVar1 = ON_SubDEdgePtr::RelativeVertex(&local_58,0);
          bVar5 = true;
          if (pOVar1 == local_50) {
            unaff_R12 = ON_SubDEdgePtr::Reversed(&local_58);
            bVar5 = false;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
          bVar5 = true;
        }
        if (!bVar5) break;
        uVar3 = uVar3 + 1;
        bVar4 = uVar3 < v0->m_edge_count;
      } while (bVar4);
    }
    if (!bVar4) {
      unaff_R12 = AllocateEdge(local_48,v0,local_40,local_50,local_38);
    }
  }
  return (ON_SubDEdgePtr)unaff_R12.m_ptr;
}

Assistant:

const ON_SubDEdgePtr ON_SubD_FixedSizeHeap::FindOrAllocateEdge(
  ON_SubDVertex * v0,
  double v0_sector_coefficient,
  ON_SubDVertex * v1,
  double v1_sector_coefficient
)
{
  if ( nullptr == v0 || nullptr == v0->m_edges)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  if ( nullptr == v1 || nullptr == v1->m_edges)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  for (unsigned short v0ei = 0; v0ei < v0->m_edge_count; ++v0ei)
  {
    const ON_SubDEdgePtr ep = v0->m_edges[v0ei];
    if (v0 == ep.RelativeVertex(0))
    {
      if (v1 == ep.RelativeVertex(1))
        return ep;
    }
    else if (v0 == ep.RelativeVertex(1))
    {
      if (v1 == ep.RelativeVertex(0))
        return ep.Reversed();
    }
    else
    {
      ON_SUBD_RETURN_ERROR("Invalid ON_SubDEdgePtr in vertex->m_edge[] array");
    }
  }

  return AllocateEdge(v0, v0_sector_coefficient, v1, v1_sector_coefficient);
}